

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_21d977f::Target::DumpLauncher
          (Value *__return_storage_ptr__,Target *this,char *name,char *type)

{
  cmGeneratorTarget *this_00;
  pointer pcVar1;
  bool bVar2;
  cmValue cVar3;
  Value *extraout_RAX;
  cmLocalGenerator *this_01;
  cmake *cmakeInstance;
  string *psVar4;
  Value *pVVar5;
  Value *extraout_RAX_00;
  String *value;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  Value args;
  string command;
  cmList commandWithArgs;
  cmGeneratorExpression ge;
  ValueHolder local_110 [2];
  long local_100 [3];
  string local_e8;
  ValueHolder local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  cmList local_a0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_88;
  char *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58 [2];
  cmGeneratorExpression local_48;
  
  this_00 = this->GT;
  local_70 = type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110[0].bool_,name,(allocator<char> *)&local_c8.bool_);
  cVar3 = cmGeneratorTarget::GetProperty(this_00,(string *)local_110);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0].string_,local_100[0] + 1);
  }
  Json::Value::Value(__return_storage_ptr__,nullValue);
  pVVar5 = extraout_RAX;
  if (cVar3.Value != (string *)0x0) {
    this_01 = cmGeneratorTarget::GetLocalGenerator(this->GT);
    cmakeInstance = cmLocalGenerator::GetCMakeInstance(this_01);
    local_88.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_88.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_88);
    cmGeneratorExpression::cmGeneratorExpression
              (&local_48,cmakeInstance,(cmListFileBacktrace *)&local_88);
    if (local_88.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pcVar1 = ((cVar3.Value)->_M_dataplus)._M_p;
    local_68._M_allocated_capacity = (size_type)local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + (cVar3.Value)->_M_string_length);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_e8,(string *)&local_48);
    local_c0 = 0;
    local_b8 = 0;
    local_c8.string_ = &local_b8;
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_e8._M_dataplus._M_p,this_01,
                        this->Config,(cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0
                        ,(cmGeneratorTarget *)0x0,(string *)&local_c8);
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    local_110[0].string_ = (char *)local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_110,pcVar1,pcVar1 + psVar4->_M_string_length);
    init._M_len = 1;
    init._M_array = (iterator)local_110;
    cmList::cmList(&local_a0,init);
    if (local_110[0] != local_100) {
      operator_delete(local_110[0].string_,local_100[0] + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8.string_,CONCAT71(uStack_b7,local_b8) + 1);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_e8);
    if ((_Alloc_hider *)local_68._M_allocated_capacity != local_58) {
      operator_delete((void *)local_68._M_allocated_capacity,(ulong)(local_58[0]._M_p + 1));
    }
    if ((local_a0.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_a0.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((local_a0.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 0)) {
      pcVar1 = ((local_a0.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar1,
                 pcVar1 + (local_a0.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      cmsys::SystemTools::ConvertToUnixSlashes(&local_e8);
      Json::Value::Value((Value *)local_110,objectValue);
      Json::Value::operator=(__return_storage_ptr__,(Value *)local_110);
      Json::Value::~Value((Value *)local_110);
      cmSystemTools::RelativeIfUnder((string *)&local_c8,&this->TopSource,&local_e8);
      Json::Value::Value((Value *)local_110,(String *)&local_c8);
      pVVar5 = Json::Value::operator[](__return_storage_ptr__,"command");
      Json::Value::operator=(pVVar5,(Value *)local_110);
      Json::Value::~Value((Value *)local_110);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8.string_,CONCAT71(uStack_b7,local_b8) + 1);
      }
      Json::Value::Value((Value *)local_110,local_70);
      pVVar5 = Json::Value::operator[](__return_storage_ptr__,"type");
      Json::Value::operator=(pVVar5,(Value *)local_110);
      Json::Value::~Value((Value *)local_110);
      Json::Value::Value((Value *)local_110,nullValue);
      value = local_a0.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
      if (value != local_a0.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          Json::Value::Value((Value *)&local_c8,value);
          Json::Value::append((Value *)local_110,(Value *)&local_c8);
          Json::Value::~Value((Value *)&local_c8);
          value = value + 1;
        } while (value != local_a0.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      bVar2 = Json::Value::empty((Value *)local_110);
      if (!bVar2) {
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,"arguments");
        Json::Value::operator=(pVVar5,(Value *)local_110);
      }
      Json::Value::~Value((Value *)local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0.Values);
    cmGeneratorExpression::~cmGeneratorExpression(&local_48);
    pVVar5 = extraout_RAX_00;
  }
  return pVVar5;
}

Assistant:

Json::Value Target::DumpLauncher(const char* name, const char* type)
{
  cmValue property = this->GT->GetProperty(name);
  Json::Value launcher;
  if (property) {
    cmLocalGenerator* lg = this->GT->GetLocalGenerator();
    cmGeneratorExpression ge(*lg->GetCMakeInstance());
    cmList commandWithArgs{ ge.Parse(*property)->Evaluate(lg, this->Config) };
    if (!commandWithArgs.empty() && !commandWithArgs[0].empty()) {
      std::string command(commandWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(command);
      launcher = Json::objectValue;
      launcher["command"] = RelativeIfUnder(this->TopSource, command);
      launcher["type"] = type;
      Json::Value args;
      for (std::string const& arg : cmMakeRange(commandWithArgs).advance(1)) {
        args.append(arg);
      }
      if (!args.empty()) {
        launcher["arguments"] = std::move(args);
      }
    }
  }
  return launcher;
}